

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_link(void)

{
  ssize_t sVar1;
  int iVar2;
  uv_loop_t *loop;
  undefined8 uVar3;
  char *pcVar4;
  uv_buf_t uVar5;
  uv_fs_t req;
  
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_open(0,&req,"test_file",0x42,0x180,0);
  sVar1 = req.result;
  uVar5.len = iov.len;
  uVar5.base = iov.base;
  if (iVar2 < 0) {
    pcVar4 = "r >= 0";
    uVar3 = 0x791;
  }
  else if (req.result < 0) {
    pcVar4 = "req.result >= 0";
    uVar3 = 0x792;
    iov = uVar5;
  }
  else {
    uv_fs_req_cleanup(&req);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar2 = uv_fs_write(0,&req,sVar1 & 0xffffffff,&iov,1,0xffffffffffffffff,0);
    if (iVar2 == 0xd) {
      if (req.result == 0xd) {
        uv_fs_req_cleanup(&req);
        uv_fs_close(::loop,&req,sVar1 & 0xffffffff,0);
        iVar2 = uv_fs_link(0,&req,"test_file","test_file_link",0);
        if (iVar2 == 0) {
          if (req.result == 0) {
            uv_fs_req_cleanup(&req);
            iVar2 = uv_fs_open(0,&req,"test_file_link",2,0,0);
            sVar1 = req.result;
            if (iVar2 < 0) {
              pcVar4 = "r >= 0";
              uVar3 = 0x7a5;
            }
            else if (req.result < 0) {
              pcVar4 = "req.result >= 0";
              uVar3 = 0x7a6;
            }
            else {
              uv_fs_req_cleanup(&req);
              buf[0x10] = '\0';
              buf[0x11] = '\0';
              buf[0x12] = '\0';
              buf[0x13] = '\0';
              buf[0x14] = '\0';
              buf[0x15] = '\0';
              buf[0x16] = '\0';
              buf[0x17] = '\0';
              buf[0x18] = '\0';
              buf[0x19] = '\0';
              buf[0x1a] = '\0';
              buf[0x1b] = '\0';
              buf[0x1c] = '\0';
              buf[0x1d] = '\0';
              buf[0x1e] = '\0';
              buf[0x1f] = '\0';
              buf[0] = '\0';
              buf[1] = '\0';
              buf[2] = '\0';
              buf[3] = '\0';
              buf[4] = '\0';
              buf[5] = '\0';
              buf[6] = '\0';
              buf[7] = '\0';
              buf[8] = '\0';
              buf[9] = '\0';
              buf[10] = '\0';
              buf[0xb] = '\0';
              buf[0xc] = '\0';
              buf[0xd] = '\0';
              buf[0xe] = '\0';
              buf[0xf] = '\0';
              uVar5 = (uv_buf_t)uv_buf_init(buf,0x20);
              iov = uVar5;
              iVar2 = uv_fs_read(0,&req,sVar1 & 0xffffffff,&iov,1,0,0);
              if (iVar2 < 0) {
                pcVar4 = "r >= 0";
                uVar3 = 0x7ad;
              }
              else if (req.result < 0) {
                pcVar4 = "req.result >= 0";
                uVar3 = 0x7ae;
              }
              else {
                iVar2 = strcmp(buf,test_buf);
                if (iVar2 == 0) {
                  close((int)sVar1);
                  iVar2 = uv_fs_link(::loop,&req,"test_file","test_file_link2",link_cb);
                  if (iVar2 == 0) {
                    uv_run(::loop,0);
                    if (link_cb_count == 1) {
                      iVar2 = uv_fs_open(0,&req,"test_file_link2",2,0,0);
                      sVar1 = req.result;
                      if (iVar2 < 0) {
                        pcVar4 = "r >= 0";
                        uVar3 = 0x7ba;
                      }
                      else if (req.result < 0) {
                        pcVar4 = "req.result >= 0";
                        uVar3 = 0x7bb;
                      }
                      else {
                        uv_fs_req_cleanup(&req);
                        buf[0x10] = '\0';
                        buf[0x11] = '\0';
                        buf[0x12] = '\0';
                        buf[0x13] = '\0';
                        buf[0x14] = '\0';
                        buf[0x15] = '\0';
                        buf[0x16] = '\0';
                        buf[0x17] = '\0';
                        buf[0x18] = '\0';
                        buf[0x19] = '\0';
                        buf[0x1a] = '\0';
                        buf[0x1b] = '\0';
                        buf[0x1c] = '\0';
                        buf[0x1d] = '\0';
                        buf[0x1e] = '\0';
                        buf[0x1f] = '\0';
                        buf[0] = '\0';
                        buf[1] = '\0';
                        buf[2] = '\0';
                        buf[3] = '\0';
                        buf[4] = '\0';
                        buf[5] = '\0';
                        buf[6] = '\0';
                        buf[7] = '\0';
                        buf[8] = '\0';
                        buf[9] = '\0';
                        buf[10] = '\0';
                        buf[0xb] = '\0';
                        buf[0xc] = '\0';
                        buf[0xd] = '\0';
                        buf[0xe] = '\0';
                        buf[0xf] = '\0';
                        uVar5 = (uv_buf_t)uv_buf_init(buf,0x20);
                        iov = uVar5;
                        iVar2 = uv_fs_read(0,&req,sVar1 & 0xffffffff,&iov,1,0,0);
                        if (iVar2 < 0) {
                          pcVar4 = "r >= 0";
                          uVar3 = 0x7c2;
                        }
                        else if (req.result < 0) {
                          pcVar4 = "req.result >= 0";
                          uVar3 = 0x7c3;
                        }
                        else {
                          iVar2 = strcmp(buf,test_buf);
                          if (iVar2 == 0) {
                            uv_fs_close(::loop,&req,sVar1 & 0xffffffff,0);
                            uv_run(::loop,0);
                            unlink("test_file");
                            unlink("test_file_link");
                            unlink("test_file_link2");
                            loop = (uv_loop_t *)uv_default_loop();
                            close_loop(loop);
                            uVar3 = uv_default_loop();
                            iVar2 = uv_loop_close(uVar3);
                            if (iVar2 == 0) {
                              uv_library_shutdown();
                              return 0;
                            }
                            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                            uVar3 = 0x7d3;
                          }
                          else {
                            pcVar4 = "strcmp(buf, test_buf) == 0";
                            uVar3 = 0x7c4;
                          }
                        }
                      }
                    }
                    else {
                      pcVar4 = "link_cb_count == 1";
                      uVar3 = 0x7b7;
                    }
                  }
                  else {
                    pcVar4 = "r == 0";
                    uVar3 = 0x7b5;
                  }
                }
                else {
                  pcVar4 = "strcmp(buf, test_buf) == 0";
                  uVar3 = 0x7af;
                }
              }
            }
          }
          else {
            pcVar4 = "req.result == 0";
            uVar3 = 0x7a1;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x7a0;
        }
      }
      else {
        pcVar4 = "req.result == sizeof(test_buf)";
        uVar3 = 0x799;
      }
    }
    else {
      pcVar4 = "r == sizeof(test_buf)";
      uVar3 = 0x798;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_link) {
  int r;
  uv_fs_t req;
  uv_file file;
  uv_file link;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  uv_fs_close(loop, &req, file, NULL);

  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &req, "test_file_link", O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  link = req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);

  close(link);

  /* async link */
  r = uv_fs_link(loop, &req, "test_file", "test_file_link2", link_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(link_cb_count == 1);

  r = uv_fs_open(NULL, &req, "test_file_link2", O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  link = req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);

  uv_fs_close(loop, &req, link, NULL);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}